

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void __thiscall
MacProj::set_outflow_bcs
          (MacProj *this,int level,MultiFab *mac_phi,MultiFab *param_3,MultiFab *param_4,
          MultiFab *param_5)

{
  BoxArray *this_00;
  AmrLevel *pAVar1;
  pointer pGVar2;
  long *plVar3;
  pointer pBVar4;
  FArrayBox *pFVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int igrid;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  Box *this_01;
  IntVect IVar23;
  int local_1ec;
  Box ovlp;
  bool hasOutFlow;
  Box phiBox;
  int numOutFlowFaces;
  Box lhs;
  BoxArray uncovered_outflow_ba;
  IntVect low;
  int local_d8 [10];
  element_type *local_b0;
  pointer local_90;
  Orientation outFaces [6];
  BoxList phiBoxList;
  BoxList ccBoxList;
  
  outFaces[0].val = -1;
  outFaces[1].val = -1;
  outFaces[2].val = -1;
  outFaces[3].val = -1;
  outFaces[4].val = -1;
  outFaces[5].val = -1;
  OutFlowBC::GetOutFlowFaces(&hasOutFlow,outFaces,this->phys_bc,&numOutFlowFaces);
  pAVar1 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
           super__Vector_impl_data._M_start[level];
  pGVar2 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  amrex::BoxList::BoxList(&ccBoxList);
  amrex::BoxList::BoxList(&phiBoxList);
  this_00 = &pAVar1->grids;
  this_01 = (Box *)((long)(pGVar2 + level) + 0xac);
  uVar7 = (long)(pGVar2 + level) + 0xb8;
  lVar22 = 0;
  local_1ec = 0;
  do {
    if (numOutFlowFaces <= lVar22) {
      if (ccBoxList.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start !=
          ccBoxList.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        amrex::BoxArray::BoxArray(&uncovered_outflow_ba,&phiBoxList);
        amrex::BoxList::clear(&phiBoxList);
        iVar14 = 0;
        if (local_1ec < 1) {
          local_1ec = 0;
        }
        for (; iVar14 != local_1ec; iVar14 = iVar14 + 1) {
          amrex::MFIter::MFIter((MFIter *)&low,(FabArrayBase *)mac_phi,'\0');
          while (local_d8[0] < local_d8[2]) {
            iVar10 = local_d8[0];
            if ((long *)local_d8._32_8_ != (long *)0x0) {
              iVar10 = *(int *)(*(long *)local_d8._32_8_ + (long)local_d8[0] * 4);
            }
            pFVar5 = (mac_phi->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar10];
            amrex::BoxArray::operator[](&phiBox,&uncovered_outflow_ba,iVar14);
            uVar7 = *(undefined8 *)(pFVar5->super_BaseFab<double>).domain.smallend.vect;
            uVar8 = *(undefined8 *)(pFVar5->super_BaseFab<double>).domain.bigend.vect;
            uVar9 = *(undefined8 *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 8);
            ovlp.smallend.vect[2] =
                 (int)*(undefined8 *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 8);
            ovlp.bigend.vect[0] = (int)uVar8;
            ovlp.bigend.vect[1] = (int)((ulong)uVar8 >> 0x20);
            ovlp.bigend.vect[2] = (int)uVar9;
            ovlp.btype.itype = (uint)((ulong)uVar9 >> 0x20);
            ovlp.smallend.vect[0] = (int)uVar7;
            ovlp.smallend.vect[1] = (int)((ulong)uVar7 >> 0x20);
            iVar10 = phiBox.smallend.vect[0];
            if (phiBox.smallend.vect[0] < ovlp.smallend.vect[0]) {
              iVar10 = ovlp.smallend.vect[0];
            }
            iVar11 = phiBox.smallend.vect[1];
            if (phiBox.smallend.vect[1] < ovlp.smallend.vect[1]) {
              iVar11 = ovlp.smallend.vect[1];
            }
            ovlp.smallend.vect[1] = iVar11;
            ovlp.smallend.vect[0] = iVar10;
            iVar15 = phiBox.smallend.vect[2];
            if (phiBox.smallend.vect[2] < ovlp.smallend.vect[2]) {
              iVar15 = ovlp.smallend.vect[2];
            }
            ovlp.smallend.vect[2] = iVar15;
            iVar20 = phiBox.bigend.vect[0];
            if (ovlp.bigend.vect[0] < phiBox.bigend.vect[0]) {
              iVar20 = ovlp.bigend.vect[0];
            }
            ovlp.bigend.vect[0] = iVar20;
            iVar18 = phiBox.bigend.vect[1];
            if (ovlp.bigend.vect[1] < phiBox.bigend.vect[1]) {
              iVar18 = ovlp.bigend.vect[1];
            }
            ovlp.bigend.vect[1] = iVar18;
            iVar19 = phiBox.bigend.vect[2];
            if (ovlp.bigend.vect[2] < phiBox.bigend.vect[2]) {
              iVar19 = ovlp.bigend.vect[2];
            }
            ovlp.bigend.vect[2] = iVar19;
            if ((((iVar10 <= iVar20) && (iVar11 <= iVar18)) && (iVar15 <= iVar19)) &&
               (ovlp.btype.itype < 8)) {
              piVar12 = local_d8;
              if ((long *)local_d8._32_8_ != (long *)0x0) {
                piVar12 = (int *)((long)local_d8[0] * 4 + *(long *)local_d8._32_8_);
              }
              phiBox.smallend.vect[0] = 0;
              phiBox.smallend.vect[1] = 0;
              amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                        (&(mac_phi->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar12]->super_BaseFab<double>
                         ,(double *)&phiBox,&ovlp,(DestComp)0x0,(NumComps)0x1);
            }
            amrex::MFIter::operator++((MFIter *)&low);
          }
          amrex::MFIter::~MFIter((MFIter *)&low);
        }
        amrex::BoxArray::~BoxArray(&uncovered_outflow_ba);
      }
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&phiBoxList);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&ccBoxList);
      return;
    }
    uVar6 = (long)outFaces[lVar22].val % 3;
    uVar21 = uVar6 & 0xffffffff;
    if (outFaces[lVar22].val < 3) {
      uVar21 = (ulong)(int)uVar6;
      lVar17 = 0;
      do {
        plVar3 = (long *)(pAVar1->grids).m_ref.
                         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((plVar3[1] - *plVar3) / 0x1c <= lVar17) {
          if (outFaces[lVar22].val < 3) goto LAB_00352dd4;
          goto LAB_00352a12;
        }
        amrex::BoxArray::operator[]((Box *)&uncovered_outflow_ba,this_00,(int)lVar17);
        lVar17 = lVar17 + 1;
      } while (low.vect[uVar21 - 0x1a] != (this_01->smallend).vect[uVar21]);
    }
    else {
LAB_00352a12:
      lVar17 = 0;
      do {
        plVar3 = (long *)(pAVar1->grids).m_ref.
                         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((plVar3[1] - *plVar3) / 0x1c <= lVar17) goto LAB_00352dd4;
        amrex::BoxArray::operator[]((Box *)&uncovered_outflow_ba,this_00,(int)lVar17);
        lVar17 = lVar17 + 1;
      } while (low.vect[uVar21 - 0x17] != *(int *)(uVar7 + uVar21 * 4));
    }
    uVar6 = (long)outFaces[lVar22].val % 3;
    uVar21 = uVar6 & 0xffffffff;
    ovlp.smallend.vect[0] = 1;
    ovlp.smallend.vect[1] = 1;
    ovlp.smallend.vect[2] = 1;
    ovlp.bigend.vect[0] = 0;
    ovlp.bigend.vect[1] = 0;
    ovlp.bigend.vect[2] = 0;
    ovlp.btype.itype = 0;
    uVar16 = (uint)uVar6;
    if (outFaces[lVar22].val - 3U < 3) {
      low.vect[2] = *(int *)((long)(pGVar2 + level) + 0xb4);
      low.vect._0_8_ = *(undefined8 *)(this_01->smallend).vect;
      phiBox.smallend.vect[2] = *(int *)((long)(pGVar2 + level) + 0xc0);
      phiBox.smallend.vect._0_8_ = *(undefined8 *)uVar7;
      IVar23 = amrex::Box::type(this_01);
      lhs.smallend.vect._0_8_ = IVar23.vect._0_8_;
      lhs.smallend.vect[2] = IVar23.vect[2];
      iVar14 = phiBox.smallend.vect[uVar21];
      uVar13 = ~lhs.smallend.vect[uVar21] & 1;
      low.vect[uVar21] = uVar13 + iVar14;
      phiBox.smallend.vect[uVar21] = uVar13 + iVar14 + 1;
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)low.vect[2];
      uncovered_outflow_ba.m_bat._0_8_ = low.vect._0_8_;
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = phiBox.smallend.vect[2];
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = phiBox.smallend.vect[0];
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = phiBox.smallend.vect[1];
      ovlp.smallend.vect[0] = low.vect[0];
      ovlp.smallend.vect[1] = low.vect[1];
      ovlp.smallend.vect[2] = low.vect[2];
      ovlp.bigend.vect[0] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
      ovlp.bigend.vect[1] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      ovlp.bigend.vect[2] = phiBox.smallend.vect[2];
      ovlp.btype.itype = *(uint *)((long)(pGVar2 + level) + 0xc4) & ~(1 << (uVar16 & 0x1f));
      iVar14 = -2;
    }
    else {
      low.vect[2] = *(int *)((long)(pGVar2 + level) + 0xb4);
      low.vect._0_8_ = *(undefined8 *)(this_01->smallend).vect;
      phiBox.smallend.vect[2] = *(int *)((long)(pGVar2 + level) + 0xc0);
      phiBox.smallend.vect._0_8_ = *(undefined8 *)uVar7;
      uVar21 = (ulong)(int)uVar16;
      iVar14 = low.vect[uVar21];
      low.vect[uVar21] = iVar14 + -2;
      phiBox.smallend.vect[uVar21] = iVar14 + -1;
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)low.vect[2];
      uncovered_outflow_ba.m_bat._0_8_ = low.vect._0_8_;
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = phiBox.smallend.vect[2];
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = phiBox.smallend.vect[0];
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = phiBox.smallend.vect[1];
      ovlp.smallend.vect[0] = low.vect[0];
      ovlp.smallend.vect[1] = low.vect[1];
      ovlp.smallend.vect[2] = low.vect[2];
      ovlp.bigend.vect[0] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
      ovlp.bigend.vect[1] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      ovlp.bigend.vect[2] = phiBox.smallend.vect[2];
      ovlp.btype.itype = *(uint *)((long)(pGVar2 + level) + 0xc4) & ~(1 << (uVar16 & 0x1f));
      iVar14 = 2;
    }
    piVar12 = ovlp.smallend.vect + uVar21;
    ovlp.smallend.vect._0_8_ = low.vect._0_8_;
    ovlp.smallend.vect[2] = low.vect[2];
    ovlp.bigend.vect[0] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
    ovlp.bigend.vect[1] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
    ovlp.bigend.vect[2] = phiBox.smallend.vect[2];
    uncovered_outflow_ba.m_bat._0_8_ = low.vect._0_8_;
    uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)low.vect[2];
    uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = phiBox.smallend.vect[2];
    *piVar12 = *piVar12 + iVar14;
    piVar12 = ovlp.bigend.vect + uVar21;
    *piVar12 = *piVar12 + iVar14;
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&ccBoxList,&ovlp);
    uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype =
         (IndexType)(IndexType)*(uint *)((long)(pGVar2 + level) + 0xb4);
    uncovered_outflow_ba.m_bat._0_8_ = *(undefined8 *)(this_01->smallend).vect;
    low.vect[2] = *(int *)((long)(pGVar2 + level) + 0xc0);
    low.vect._0_8_ = *(undefined8 *)uVar7;
    uVar6 = (long)outFaces[lVar22].val % 3;
    uVar21 = uVar6 & 0xffffffff;
    uVar16 = (uint)uVar6;
    if (outFaces[lVar22].val < 3) {
      uVar21 = (ulong)(int)uVar16;
      iVar14 = low.vect[uVar21 - 0x1a] + -1;
    }
    else {
      IVar23 = amrex::Box::type(this_01);
      lhs.smallend.vect._0_8_ = IVar23.vect._0_8_;
      lhs.smallend.vect[2] = IVar23.vect[2];
      iVar14 = (~lhs.smallend.vect[uVar21] & 1U) + low.vect[uVar21];
    }
    low.vect[uVar21 - 0x1a] = iVar14;
    low.vect[uVar21] = iVar14;
    phiBox.btype.itype = *(uint *)((long)(pGVar2 + level) + 0xc4) & ~(1 << (uVar16 & 0x1f));
    phiBox.smallend.vect[2] = (int)uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype;
    phiBox.smallend.vect._0_8_ = uncovered_outflow_ba.m_bat._0_8_;
    phiBox.bigend.vect[2] = low.vect[2];
    phiBox.bigend.vect[0] = low.vect[0];
    phiBox.bigend.vect[1] = low.vect[1];
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&phiBoxList,&phiBox);
    lhs.btype.itype = ovlp.btype.itype;
    lhs.bigend.vect[2] = ovlp.bigend.vect[2];
    lhs.bigend.vect[1] = ovlp.bigend.vect[1];
    lhs.smallend.vect[0] = ovlp.smallend.vect[0];
    lhs.smallend.vect[1] = ovlp.smallend.vect[1];
    lhs.smallend.vect[2] = ovlp.smallend.vect[2];
    lhs.bigend.vect[0] = ovlp.bigend.vect[0];
    amrex::Box::operator&=(&lhs,this_01);
    amrex::complementIn(&uncovered_outflow_ba,&lhs,this_00);
    if (((uncovered_outflow_ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        ((uncovered_outflow_ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      amrex::intersect((BoxArray *)&low,this_00,&lhs,0);
      local_90 = (local_b0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pBVar4 = (local_b0->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      amrex::BoxArray::~BoxArray((BoxArray *)&low);
      if (local_90 != pBVar4) {
        amrex::Error_host("MacProj: Cannot yet handle partially refined outflow");
      }
    }
    local_1ec = local_1ec + 1;
    amrex::BoxArray::~BoxArray(&uncovered_outflow_ba);
LAB_00352dd4:
    lVar22 = lVar22 + 1;
  } while( true );
}

Assistant:

void
MacProj::set_outflow_bcs (int             level,
                          MultiFab*       mac_phi,
                          const MultiFab* /*u_mac*/,
                          const MultiFab& /*S*/,
                          const MultiFab& /*divu*/)
{
    //
    // This code is very similar to the outflow BC stuff in the Projection
    // class except that here the the phi to be solved for lives on the
    // out-directed faces.  The projection equation to satisfy is
    //
    //   (1/r)(d/dr)[r/rho dphi/dr] = dv/dr - S
    //
    bool hasOutFlow;
    Orientation outFaces[2*BL_SPACEDIM];
    int numOutFlowFaces;

    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFaces);

    const BoxArray&   grids  = LevelData[level]->boxArray();
    const Geometry&   geom   = parent->Geom(level);
    const Box&        domain = parent->Geom(level).Domain();
    //
    // Create 1-wide cc box just outside boundary to hold phi.
    //
    BoxList ccBoxList, phiBoxList;
    // numOutFlowFaces gives the number of outflow faces on the entire
    //   problem domain
    // nOutFlowTouched gives the number of outflow faces a level touches, so
    //   nOutFlowTouched = numOutFlowFaces for level 0, but
    //   nOutFlowTouched <= numOutFlowFaces for levels > 0, since
    //   finer levels may not span the entire problem domain
    int nOutFlowTouched = 0;
    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
        if (grids_on_side_of_domain(grids,geom.Domain(),outFaces[iface]))
        {
            nOutFlowTouched++;
            const int outDir    = outFaces[iface].coordDir();

            Box ccBndBox;
            if (outFaces[iface].faceDir() == Orientation::high)
            {
                ccBndBox = amrex::adjCellHi(domain,outDir,2);
                ccBndBox.shift(outDir,-2);
            }
            else
            {
                ccBndBox = amrex::adjCellLo(domain,outDir,2);
                ccBndBox.shift(outDir,2);
            }
            ccBoxList.push_back(ccBndBox);

            Box phiBox  = amrex::adjCell(domain,outFaces[iface],1);
            phiBoxList.push_back(phiBox);

            const Box&     valid_ccBndBox       = ccBndBox & domain;
            const BoxArray uncovered_outflow_ba = amrex::complementIn(valid_ccBndBox,grids);

            if (uncovered_outflow_ba.size() &&
                amrex::intersect(grids,valid_ccBndBox).size())
                amrex::Error("MacProj: Cannot yet handle partially refined outflow");
        }
    }

    if ( !ccBoxList.isEmpty() )
    {
        BoxArray phiBoxArray(phiBoxList);
        phiBoxList.clear();

        //
        // Must do this kind of copy instead of mac_phi->copy(phidat);
        // because we're copying onto the ghost cells of the FABs,
        // not the valid regions.
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for ( int iface = 0; iface < nOutFlowTouched; ++iface )
        {
            for (MFIter mfi(*mac_phi); mfi.isValid(); ++mfi)
            {
                Box ovlp = (*mac_phi)[mfi].box() & phiBoxArray[iface];
                if (ovlp.ok()) {
                      (*mac_phi)[mfi].setVal<RunOn::Gpu>(0,ovlp,0,1);
                }
            }
        }
    }
}